

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O1

void __thiscall serial::Serial::flush(Serial *this)

{
  SerialImpl *this_00;
  SerialImpl *this_01;
  
  this_00 = this->pimpl_;
  SerialImpl::readLock(this_00);
  this_01 = this->pimpl_;
  SerialImpl::writeLock(this_01);
  SerialImpl::flush(this->pimpl_);
  SerialImpl::writeUnlock(this_01);
  SerialImpl::readUnlock(this_00);
  return;
}

Assistant:

void Serial::flush ()
{
  ScopedReadLock rlock(this->pimpl_);
  ScopedWriteLock wlock(this->pimpl_);
  pimpl_->flush ();
}